

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O3

void __thiscall
nuraft::raft_server::handle_install_snapshot_resp_new_member(raft_server *this,resp_msg *resp)

{
  type tVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  peer *pp;
  int iVar5;
  element_type *peVar6;
  ptr<snapshot_sync_ctx> sync_ctx;
  string local_50;
  snapshot_sync_ctx *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  peVar6 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar6 == (element_type *)0x0) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      return;
    }
    iVar5 = (*peVar2->_vptr_logger[7])();
    if (iVar5 < 4) {
      return;
    }
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_(&local_50,"no server to join, the response must be very old.");
    (*peVar2->_vptr_logger[8])
              (peVar2,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
               ,"handle_install_snapshot_resp_new_member",0x195,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return;
    }
    operator_delete(local_50._M_dataplus._M_p);
    return;
  }
  if (resp->accepted_ == false) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar5 = (*peVar2->_vptr_logger[7])(), 2 < iVar5)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_50,
                 "peer doesn\'t accept the snapshot installation request, next log idx %lu, but we can move forward"
                 ,resp->next_idx_);
      (*peVar2->_vptr_logger[8])
                (peVar2,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp_new_member",0x19d,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    LOCK();
    (((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    next_log_idx_).super___atomic_base<unsigned_long>._M_i = resp->next_idx_;
    UNLOCK();
    peVar6 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  }
  timer_helper::reset(&peVar6->last_resp_timer_);
  peer::get_snapshot_sync_ctx((peer *)&stack0xffffffffffffffd0);
  if (local_30 == (snapshot_sync_ctx *)0x0) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar5 = (*peVar2->_vptr_logger[7])(), 0 < iVar5)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_50,
                 "SnapshotSyncContext must not be null: src %d dst %d my id %d leader id %d, maybe leader election happened in the meantime. next heartbeat or append request will cover it up."
                 ,(ulong)(uint)(resp->super_msg_base).src_,(ulong)(uint)(resp->super_msg_base).dst_,
                 (ulong)(uint)this->id_,(ulong)(uint)(this->leader_).super___atomic_base<int>._M_i);
      (*peVar2->_vptr_logger[8])
                (peVar2,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp_new_member",0x1a8,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    goto LAB_00226d7c;
  }
  peVar3 = (local_30->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_00 = (local_30->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  tVar1 = peVar3->type_;
  if (tVar1 == logical_object) {
    peVar4 = (resp->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_01 = (resp->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    if (peVar4 == (element_type *)0x0) goto LAB_00226b8e;
LAB_00226c36:
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar5 = (*peVar2->_vptr_logger[7])(), 3 < iVar5)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_50,"snapshot install is done\n");
      (*peVar2->_vptr_logger[8])
                (peVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp_new_member",0x1b5,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    LOCK();
    (((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    next_log_idx_).super___atomic_base<unsigned_long>._M_i =
         ((local_30->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->last_log_idx_ + 1;
    UNLOCK();
    pp = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pp->matched_idx_ =
         ((local_30->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->last_log_idx_;
    clear_snapshot_sync_ctx(this,pp);
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar5 = (*peVar2->_vptr_logger[7])(), 3 < iVar5)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_50,
                 "snapshot has been copied and applied to new server, continue to sync logs after snapshot, next log idx %lu, matched idx %lu"
                 ,(((this->srv_to_join_).
                    super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  next_log_idx_).super___atomic_base<unsigned_long>._M_i,
                 ((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->matched_idx_);
      (*peVar2->_vptr_logger[8])
                (peVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp_new_member",0x1c1,&local_50);
LAB_00226d49:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
  }
  else {
    if ((tVar1 == raw_binary) && (peVar3->size_ <= resp->next_idx_)) goto LAB_00226c36;
LAB_00226b8e:
    snapshot_sync_ctx::set_offset(local_30,resp->next_idx_);
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar5 = (*peVar2->_vptr_logger[7])(), 4 < iVar5)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_50,"continue to send snapshot to new server at offset %lu",resp->next_idx_);
      (*peVar2->_vptr_logger[8])
                (peVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp_new_member",0x1c5,&local_50);
      goto LAB_00226d49;
    }
  }
  sync_log_to_new_srv(this,(((this->srv_to_join_).
                             super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           next_log_idx_).super___atomic_base<unsigned_long>._M_i);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_00226d7c:
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  return;
}

Assistant:

void raft_server::handle_install_snapshot_resp_new_member(resp_msg& resp) {
    if (!srv_to_join_) {
        p_in("no server to join, the response must be very old.");
        return;
    }

    if (!resp.get_accepted()) {
        p_wn("peer doesn't accept the snapshot installation request, "
             "next log idx %" PRIu64 ", "
             "but we can move forward",
             resp.get_next_idx());
        srv_to_join_->set_next_log_idx(resp.get_next_idx());
    }
    srv_to_join_->reset_resp_timer();

    ptr<snapshot_sync_ctx> sync_ctx = srv_to_join_->get_snapshot_sync_ctx();
    if (sync_ctx == nullptr) {
        p_ft("SnapshotSyncContext must not be null: "
             "src %d dst %d my id %d leader id %d, "
             "maybe leader election happened in the meantime. "
             "next heartbeat or append request will cover it up.",
             resp.get_src(), resp.get_dst(), id_, leader_.load());
        return;
    }

    ptr<snapshot> snp = sync_ctx->get_snapshot();
    bool snp_install_done =
        ( snp->get_type() == snapshot::raw_binary &&
          resp.get_next_idx() >= snp->size() )         ||
        ( snp->get_type() == snapshot::logical_object &&
          resp.get_ctx() );

    if (snp_install_done) {
        // snapshot is done
        p_in("snapshot install is done\n");
        srv_to_join_->set_next_log_idx
            ( sync_ctx->get_snapshot()->get_last_log_idx() + 1 );
        srv_to_join_->set_matched_idx
            ( sync_ctx->get_snapshot()->get_last_log_idx() );

        clear_snapshot_sync_ctx(*srv_to_join_);

        p_in( "snapshot has been copied and applied to new server, "
              "continue to sync logs after snapshot, "
              "next log idx %" PRIu64 ", matched idx %" PRIu64 "",
              srv_to_join_->get_next_log_idx(),
              srv_to_join_->get_matched_idx() );
    } else {
        sync_ctx->set_offset(resp.get_next_idx());
        p_db( "continue to send snapshot to new server at offset %" PRIu64 "",
              resp.get_next_idx() );
    }

    sync_log_to_new_srv(srv_to_join_->get_next_log_idx());
}